

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86DisassemblerDecoder.c
# Opt level: O0

int getIDWithAttrMask(uint16_t *instructionID,InternalInstruction *insn,uint16_t attrMask)

{
  InstrUID IVar1;
  int iVar2;
  InstructionContext local_28;
  InstructionContext instructionClass;
  _Bool hasModRMExtension;
  uint16_t attrMask_local;
  InternalInstruction *insn_local;
  uint16_t *instructionID_local;
  
  if ((insn->opcode == '\x0e') && (insn->opcodeType == T3DNOW_MAP)) {
    *instructionID = 0x2fc;
  }
  else {
    if (insn->opcodeType == T3DNOW_MAP) {
      local_28 = IC_OF;
    }
    else {
      local_28 = contextForAttrs(attrMask);
    }
    iVar2 = modRMRequired(insn->opcodeType,local_28,(ushort)insn->opcode);
    if (iVar2 == 0) {
      IVar1 = decode(insn->opcodeType,local_28,insn->opcode,'\0');
      *instructionID = IVar1;
    }
    else {
      iVar2 = readModRM(insn);
      if (iVar2 != 0) {
        return -1;
      }
      IVar1 = decode(insn->opcodeType,local_28,insn->opcode,insn->modRM);
      *instructionID = IVar1;
    }
  }
  return 0;
}

Assistant:

static int getIDWithAttrMask(uint16_t *instructionID,
		struct InternalInstruction *insn,
		uint16_t attrMask)
{
	bool hasModRMExtension;

	InstructionContext instructionClass;

#ifndef CAPSTONE_X86_REDUCE
	// HACK for femms. to be handled properly in next version 3.x
	if (insn->opcode == 0x0e && insn->opcodeType == T3DNOW_MAP) {
		*instructionID = X86_FEMMS;
		return 0;
	}
#endif

	if (insn->opcodeType == T3DNOW_MAP)
		instructionClass = IC_OF;
	else
		instructionClass = contextForAttrs(attrMask);

	hasModRMExtension = modRMRequired(insn->opcodeType,
			instructionClass,
			insn->opcode) != 0;

	if (hasModRMExtension) {
		if (readModRM(insn))
			return -1;

		*instructionID = decode(insn->opcodeType,
				instructionClass,
				insn->opcode,
				insn->modRM);
	} else {
		*instructionID = decode(insn->opcodeType,
				instructionClass,
				insn->opcode,
				0);
	}

	return 0;
}